

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bio.c
# Opt level: O2

int bio_flush(opj_bio_t *bio)

{
  int iVar1;
  int iVar2;
  
  bio->ct = 0;
  iVar1 = bio_byteout(bio);
  iVar2 = 1;
  if (iVar1 == 0) {
    if (bio->ct == 7) {
      bio->ct = 0;
      iVar2 = bio_byteout(bio);
      if (iVar2 != 0) {
        return 1;
      }
    }
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int bio_flush(opj_bio_t *bio) {
	bio->ct = 0;
	if (bio_byteout(bio)) {
		return 1;
	}
	if (bio->ct == 7) {
		bio->ct = 0;
		if (bio_byteout(bio)) {
			return 1;
		}
	}
	return 0;
}